

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void iidentity_col_8xn_ssse3
               (uint8_t *output,int stride,__m128i *buf,int shift,int height,int txh_idx)

{
  ulong uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  int iVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar32 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  iVar20 = 1 << (~(byte)shift & 0x1f);
  auVar22 = pshuflw(ZEXT416((uint)NewSqrt2list[height]),ZEXT416((uint)NewSqrt2list[height]),0);
  auVar25._0_12_ = auVar22._0_12_;
  auVar25._12_2_ = auVar22._6_2_;
  auVar25._14_2_ = 0x800;
  auVar24._12_4_ = auVar25._12_4_;
  auVar24._0_10_ = auVar22._0_10_;
  auVar24._10_2_ = 0x800;
  auVar35._10_6_ = auVar24._10_6_;
  auVar35._0_8_ = auVar22._0_8_;
  auVar35._8_2_ = auVar22._4_2_;
  auVar27._8_8_ = auVar35._8_8_;
  auVar27._0_8_ = 0x800000000000000;
  auVar23._6_10_ = auVar27._6_10_;
  auVar23._4_2_ = auVar22._2_2_;
  auVar23._0_2_ = auVar22._0_2_;
  auVar23._2_2_ = 0x800;
  auVar22 = ZEXT416((uint)-shift);
  for (lVar21 = 0; lVar21 != 0x80; lVar21 = lVar21 + 0x10) {
    auVar27 = *(undefined1 (*) [16])((long)*buf + lVar21);
    auVar34._0_12_ = auVar27._0_12_;
    auVar34._12_2_ = auVar27._6_2_;
    auVar34._14_2_ = 1;
    auVar33._12_4_ = auVar34._12_4_;
    auVar33._0_10_ = auVar27._0_10_;
    auVar33._10_2_ = 1;
    auVar32._10_6_ = auVar33._10_6_;
    auVar32._0_8_ = auVar27._0_8_;
    auVar32._8_2_ = auVar27._4_2_;
    auVar31._8_8_ = auVar32._8_8_;
    auVar31._0_8_ = 0x1000000000000;
    auVar30._6_10_ = auVar31._6_10_;
    auVar30._4_2_ = auVar27._2_2_;
    auVar30._0_2_ = auVar27._0_2_;
    auVar30._2_2_ = 1;
    auVar26._2_2_ = 0;
    auVar26._0_2_ = auVar27._8_2_;
    auVar26._4_2_ = auVar27._10_2_;
    auVar26._6_2_ = 0;
    auVar26._8_2_ = auVar27._12_2_;
    auVar26._10_2_ = 0;
    auVar26._12_2_ = auVar27._14_2_;
    auVar26._14_2_ = 1;
    auVar35 = pmaddwd(auVar30,auVar23);
    auVar27 = pmaddwd(auVar26,auVar23);
    auVar36._0_4_ = (auVar35._0_4_ >> 0xc) + iVar20 >> auVar22;
    auVar36._4_4_ = (auVar35._4_4_ >> 0xc) + iVar20 >> auVar22;
    auVar36._8_4_ = (auVar35._8_4_ >> 0xc) + iVar20 >> auVar22;
    auVar36._12_4_ = (auVar35._12_4_ >> 0xc) + iVar20 >> auVar22;
    auVar28._0_4_ = (auVar27._0_4_ >> 0xc) + iVar20 >> auVar22;
    auVar28._4_4_ = (auVar27._4_4_ >> 0xc) + iVar20 >> auVar22;
    auVar28._8_4_ = (auVar27._8_4_ >> 0xc) + iVar20 >> auVar22;
    auVar28._12_4_ = (auVar27._12_4_ >> 0xc) + iVar20 >> auVar22;
    auVar27 = packssdw(auVar36,auVar28);
    uVar1 = *(ulong *)output;
    auVar10._8_6_ = 0;
    auVar10._0_8_ = uVar1;
    auVar10[0xe] = (char)(uVar1 >> 0x38);
    auVar11._8_4_ = 0;
    auVar11._0_8_ = uVar1;
    auVar11[0xc] = (char)(uVar1 >> 0x30);
    auVar11._13_2_ = auVar10._13_2_;
    auVar12._8_4_ = 0;
    auVar12._0_8_ = uVar1;
    auVar12._12_3_ = auVar11._12_3_;
    auVar13._8_2_ = 0;
    auVar13._0_8_ = uVar1;
    auVar13[10] = (char)(uVar1 >> 0x28);
    auVar13._11_4_ = auVar12._11_4_;
    auVar14._8_2_ = 0;
    auVar14._0_8_ = uVar1;
    auVar14._10_5_ = auVar13._10_5_;
    auVar15[8] = (char)(uVar1 >> 0x20);
    auVar15._0_8_ = uVar1;
    auVar15._9_6_ = auVar14._9_6_;
    auVar17._7_8_ = 0;
    auVar17._0_7_ = auVar15._8_7_;
    auVar18._1_8_ = SUB158(auVar17 << 0x40,7);
    auVar18[0] = (char)(uVar1 >> 0x18);
    auVar18._9_6_ = 0;
    auVar19._1_10_ = SUB1510(auVar18 << 0x30,5);
    auVar19[0] = (char)(uVar1 >> 0x10);
    auVar19._11_4_ = 0;
    auVar16[2] = (char)(uVar1 >> 8);
    auVar16._0_2_ = (ushort)uVar1;
    auVar16._3_12_ = SUB1512(auVar19 << 0x20,3);
    auVar29._0_2_ = (ushort)uVar1 & 0xff;
    auVar29._2_13_ = auVar16._2_13_;
    auVar29[0xf] = 0;
    auVar27 = paddsw(auVar29,auVar27);
    sVar2 = auVar27._0_2_;
    sVar3 = auVar27._2_2_;
    sVar4 = auVar27._4_2_;
    sVar5 = auVar27._6_2_;
    sVar6 = auVar27._8_2_;
    sVar7 = auVar27._10_2_;
    sVar8 = auVar27._12_2_;
    sVar9 = auVar27._14_2_;
    *(ulong *)output =
         CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar27[0xe] - (0xff < sVar9),
                  CONCAT16((0 < sVar8) * (sVar8 < 0x100) * auVar27[0xc] - (0xff < sVar8),
                           CONCAT15((0 < sVar7) * (sVar7 < 0x100) * auVar27[10] - (0xff < sVar7),
                                    CONCAT14((0 < sVar6) * (sVar6 < 0x100) * auVar27[8] -
                                             (0xff < sVar6),
                                             CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar27[6] -
                                                      (0xff < sVar5),
                                                      CONCAT12((0 < sVar4) * (sVar4 < 0x100) *
                                                               auVar27[4] - (0xff < sVar4),
                                                               CONCAT11((0 < sVar3) *
                                                                        (sVar3 < 0x100) * auVar27[2]
                                                                        - (0xff < sVar3),
                                                                        (0 < sVar2) *
                                                                        (sVar2 < 0x100) * auVar27[0]
                                                                        - (0xff < sVar2))))))));
    output = (uint8_t *)((long)output + (long)stride);
  }
  return;
}

Assistant:

static inline void iidentity_col_8xn_ssse3(uint8_t *output, int stride,
                                           __m128i *buf, int shift, int height,
                                           int txh_idx) {
  const __m128i scale = _mm_set1_epi16(NewSqrt2list[txh_idx]);
  const __m128i scale_rounding = _mm_set1_epi16(1 << (NewSqrt2Bits - 1));
  const __m128i shift_rounding = _mm_set1_epi32(1 << (-shift - 1));
  const __m128i one = _mm_set1_epi16(1);
  const __m128i scale_coeff = _mm_unpacklo_epi16(scale, scale_rounding);
  const __m128i zero = _mm_setzero_si128();
  for (int h = 0; h < height; ++h) {
    __m128i lo = _mm_unpacklo_epi16(buf[h], one);
    __m128i hi = _mm_unpackhi_epi16(buf[h], one);
    lo = _mm_madd_epi16(lo, scale_coeff);
    hi = _mm_madd_epi16(hi, scale_coeff);
    lo = _mm_srai_epi32(lo, NewSqrt2Bits);
    hi = _mm_srai_epi32(hi, NewSqrt2Bits);
    lo = _mm_add_epi32(lo, shift_rounding);
    hi = _mm_add_epi32(hi, shift_rounding);
    lo = _mm_srai_epi32(lo, -shift);
    hi = _mm_srai_epi32(hi, -shift);
    __m128i x = _mm_packs_epi32(lo, hi);

    const __m128i pred = _mm_loadl_epi64((__m128i const *)(output));
    x = _mm_adds_epi16(x, _mm_unpacklo_epi8(pred, zero));
    const __m128i u = _mm_packus_epi16(x, x);
    _mm_storel_epi64((__m128i *)(output), u);
    output += stride;
  }
}